

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::deserialize<std::vector<dap::Source,std::allocator<dap::Source>>>
          (Deserializer *this,optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_> *opt
          )

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<dap::Source,_std::allocator<dap::Source>_> v;
  optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_> *opt_local;
  Deserializer *this_local;
  
  v.super__Vector_base<dap::Source,_std::allocator<dap::Source>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)opt;
  std::vector<dap::Source,_std::allocator<dap::Source>_>::vector
            ((vector<dap::Source,_std::allocator<dap::Source>_> *)local_30);
  bVar1 = deserialize<dap::Source>
                    (this,(vector<dap::Source,_std::allocator<dap::Source>_> *)local_30);
  if (bVar1) {
    optional<std::vector<dap::Source,std::allocator<dap::Source>>>::operator=
              ((optional<std::vector<dap::Source,std::allocator<dap::Source>>> *)
               v.super__Vector_base<dap::Source,_std::allocator<dap::Source>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (vector<dap::Source,_std::allocator<dap::Source>_> *)local_30);
  }
  std::vector<dap::Source,_std::allocator<dap::Source>_>::~vector
            ((vector<dap::Source,_std::allocator<dap::Source>_> *)local_30);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}